

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcCenterLineProfileDef::~IfcCenterLineProfileDef
          (IfcCenterLineProfileDef *this)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  bool *pbVar3;
  
  this[-1].super_IfcArbitraryOpenProfileDef.super_IfcProfileDef.ProfileName.ptr._M_dataplus._M_p =
       "h>S";
  *(undefined8 *)
   &(this->super_IfcArbitraryOpenProfileDef).super_IfcProfileDef.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>.field_0x18 = 0x879f88;
  puVar1 = *(undefined1 **)&this[-1].super_IfcArbitraryOpenProfileDef.super_IfcProfileDef.field_0x60
  ;
  puVar2 = &this[-1].super_IfcArbitraryOpenProfileDef.field_0x70;
  if (puVar1 != puVar2) {
    operator_delete(puVar1,*(long *)puVar2 + 1);
  }
  puVar2 = (undefined1 *)
           this[-1].super_IfcArbitraryOpenProfileDef.super_IfcProfileDef.ProfileName.ptr.field_2.
           _M_allocated_capacity;
  pbVar3 = &this[-1].super_IfcArbitraryOpenProfileDef.super_IfcProfileDef.ProfileName.have;
  if ((bool *)puVar2 != pbVar3) {
    operator_delete(puVar2,*(long *)pbVar3 + 1);
  }
  operator_delete(&this[-1].super_IfcArbitraryOpenProfileDef.super_IfcProfileDef.ProfileName,0xa0);
  return;
}

Assistant:

IfcCenterLineProfileDef() : Object("IfcCenterLineProfileDef") {}